

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_product_definition_init(parser_info *info,char **attr)

{
  char *pcVar1;
  int iVar2;
  coda_product_definition *pcVar3;
  long *in_FS_OFFSET;
  int local_3c;
  char *pcStack_38;
  int version;
  char *version_string;
  char *format_string;
  char *id;
  char **attr_local;
  parser_info *info_local;
  
  id = (char *)attr;
  attr_local = (char **)info;
  format_string = get_mandatory_attribute_value(attr,"id",info->node->tag);
  if (format_string == (char *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    version_string =
         get_mandatory_attribute_value((char **)id,"format",*(xml_element_tag *)*attr_local);
    if (version_string == (char *)0x0) {
      info_local._4_4_ = -1;
    }
    else {
      iVar2 = coda_format_from_string(version_string,(coda_format *)(*attr_local + 0x40));
      if (iVar2 == 0) {
        pcVar1 = *attr_local;
        pcVar1[0x44] = '\x01';
        pcVar1[0x45] = '\0';
        pcVar1[0x46] = '\0';
        pcVar1[0x47] = '\0';
        pcStack_38 = get_mandatory_attribute_value
                               ((char **)id,"version",*(xml_element_tag *)*attr_local);
        if (pcStack_38 == (char *)0x0) {
          info_local._4_4_ = -1;
        }
        else {
          iVar2 = __isoc99_sscanf(pcStack_38,"%d",&local_3c);
          if (iVar2 == 1) {
            *(code **)(*attr_local + 0x38) = coda_product_definition_delete;
            pcVar3 = coda_product_definition_new
                               (format_string,*(coda_format *)(*attr_local + 0x40),local_3c);
            attr_local[7] = (char *)pcVar3;
            if (attr_local[7] == (char *)0x0) {
              info_local._4_4_ = -1;
            }
            else if ((*(int *)(*in_FS_OFFSET + -0xe4) == 0) ||
                    (iVar2 = parse_entry((za_file *)attr_local[4],ze_product,format_string,
                                         (coda_product_class *)attr_local[6],
                                         (coda_product_definition *)attr_local[7]), iVar2 == 0)) {
              *(char **)(*attr_local + 8) = attr_local[7];
              register_sub_element
                        ((node_info *)*attr_local,element_cd_description,string_data_init,
                         cd_product_definition_set_description);
              register_sub_element
                        ((node_info *)*attr_local,element_cd_detection_rule,cd_detection_rule_init,
                         cd_product_definition_add_detection_rule);
              info_local._4_4_ = 0;
            }
            else {
              coda_product_definition_delete((coda_product_definition *)attr_local[7]);
              attr_local[7] = (char *)0x0;
              *(undefined4 *)((long)attr_local + 0x4c) = 0;
              info_local._4_4_ = -1;
            }
          }
          else {
            coda_set_error(-400,"invalid \'version\' attribute value \'%s\'",pcStack_38);
            info_local._4_4_ = -1;
          }
        }
      }
      else {
        info_local._4_4_ = -1;
      }
    }
  }
  return info_local._4_4_;
}

Assistant:

static int cd_product_definition_init(parser_info *info, const char **attr)
{
    const char *id;
    const char *format_string;
    const char *version_string;
    int version;

    id = get_mandatory_attribute_value(attr, "id", info->node->tag);
    if (id == NULL)
    {
        return -1;
    }
    format_string = get_mandatory_attribute_value(attr, "format", info->node->tag);
    if (format_string == NULL)
    {
        return -1;
    }
    if (coda_format_from_string(format_string, &info->node->format) != 0)
    {
        return -1;
    }
    info->node->format_set = 1;
    version_string = get_mandatory_attribute_value(attr, "version", info->node->tag);
    if (version_string == NULL)
    {
        return -1;
    }
    if (sscanf(version_string, "%d", &version) != 1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'version' attribute value '%s'", version_string);
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_product_definition_delete;
    info->product_definition = coda_product_definition_new(id, info->node->format, version);
    if (info->product_definition == NULL)
    {
        return -1;
    }
    if (coda_option_read_all_definitions)
    {
        if (parse_entry(info->zf, ze_product, id, info->product_class, info->product_definition) != 0)
        {
            coda_product_definition_delete(info->product_definition);
            info->product_definition = NULL;
            info->add_error_location = 0;
            return -1;
        }
    }
    info->node->data = info->product_definition;

    register_sub_element(info->node, element_cd_description, string_data_init, cd_product_definition_set_description);
    register_sub_element(info->node, element_cd_detection_rule, cd_detection_rule_init,
                         cd_product_definition_add_detection_rule);

    return 0;
}